

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryOutputWindow.cpp
# Opt level: O0

void __thiscall QueryOutputWindow::print(QueryOutputWindow *this,string *message,Type type)

{
  int iVar1;
  WINDOW *pWVar2;
  QueryOutputMessage *this_00;
  undefined8 uVar3;
  string local_48;
  QueryOutputMessage *local_28;
  Type local_1c;
  string *psStack_18;
  Type type_local;
  string *message_local;
  QueryOutputWindow *this_local;
  
  local_1c = type;
  psStack_18 = message;
  message_local = (string *)this;
  this_00 = (QueryOutputMessage *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_48,(string *)message);
  QueryOutputMessage::QueryOutputMessage(this_00,&local_48,local_1c);
  local_28 = this_00;
  std::vector<QueryOutputMessage_*,_std::allocator<QueryOutputMessage_*>_>::push_back
            (&this->buffer,&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  pWVar2 = (this->super_IWindow).window;
  iVar1 = this->lineCounter;
  uVar3 = std::__cxx11::string::c_str();
  mvwprintw(pWVar2,iVar1,0,uVar3);
  (*(this->super_IWindow)._vptr_IWindow[4])();
  this->lineCounter = this->lineCounter + 1;
  return;
}

Assistant:

void QueryOutputWindow::print(std::string message, QueryOutputMessage::Type type)
{
	this->buffer.push_back(new QueryOutputMessage(message, type));

	mvwprintw(this->window, this->lineCounter, 0, message.c_str());
	this->update();
	this->lineCounter++;
}